

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

gdImagePtr gdImageScaleNearestNeighbour(gdImagePtr im,uint width,uint height)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint local_d0;
  uint local_cc;
  long n_1;
  long m_1;
  gdFixed f_b_1;
  gdFixed f_a_1;
  gdFixed f_j_1;
  gdFixed f_i_1;
  long n;
  long m;
  gdFixed f_b;
  gdFixed f_a;
  gdFixed f_j;
  gdFixed f_i;
  uint j;
  uint i;
  unsigned_long dst_offset_y;
  unsigned_long dst_offset_x;
  gdImagePtr dst_img;
  gdFixed f_dy;
  gdFixed f_dx;
  float dy;
  float dx;
  unsigned_long new_height;
  unsigned_long new_width;
  uint height_local;
  uint width_local;
  gdImagePtr im_local;
  
  local_cc = width;
  if (width < 2) {
    local_cc = 1;
  }
  local_d0 = height;
  if (height < 2) {
    local_d0 = 1;
  }
  lVar1 = (long)(((float)im->sx / (float)local_cc) * 256.0);
  lVar2 = (long)(((float)im->sy / (float)local_d0) * 256.0);
  _j = 0;
  im_local = gdImageCreateTrueColor(local_cc,local_d0);
  if (im_local == (gdImagePtr)0x0) {
    im_local = (gdImagePtr)0x0;
  }
  else {
    for (f_i._4_4_ = 0; f_i._4_4_ < local_d0; f_i._4_4_ = f_i._4_4_ + 1) {
      dst_offset_y = 0;
      if (im->trueColor == 0) {
        for (f_i._0_4_ = 0; (uint)f_i < local_cc; f_i._0_4_ = (uint)f_i + 1) {
          lVar3 = (long)((ulong)(f_i._4_4_ << 8) * lVar2) >> 0x10;
          lVar4 = (long)((ulong)((uint)f_i << 8) * lVar1) >> 0x10;
          im_local->tpixels[_j][dst_offset_y] =
               im->alpha[im->pixels[lVar3][lVar4]] * 0x1000000 +
               im->red[im->pixels[lVar3][lVar4]] * 0x10000 +
               im->green[im->pixels[lVar3][lVar4]] * 0x100 + im->blue[im->pixels[lVar3][lVar4]];
          dst_offset_y = dst_offset_y + 1;
        }
      }
      else {
        for (f_i._0_4_ = 0; (uint)f_i < local_cc; f_i._0_4_ = (uint)f_i + 1) {
          im_local->tpixels[_j][dst_offset_y] =
               im->tpixels[(long)((ulong)(f_i._4_4_ << 8) * lVar2) >> 0x10]
               [(long)((ulong)((uint)f_i << 8) * lVar1) >> 0x10];
          dst_offset_y = dst_offset_y + 1;
        }
      }
      _j = _j + 1;
    }
  }
  return im_local;
}

Assistant:

static gdImagePtr
gdImageScaleNearestNeighbour(gdImagePtr im, const unsigned int width, const unsigned int height)
{
	const unsigned long new_width = MAX(1, width);
	const unsigned long new_height = MAX(1, height);
	const float dx = (float)im->sx / (float)new_width;
	const float dy = (float)im->sy / (float)new_height;
	const gdFixed f_dx = gd_ftofx(dx);
	const gdFixed f_dy = gd_ftofx(dy);

	gdImagePtr dst_img;
	unsigned long  dst_offset_x;
	unsigned long  dst_offset_y = 0;
	unsigned int i;

	dst_img = gdImageCreateTrueColor(new_width, new_height);

	if (dst_img == NULL) {
		return NULL;
	}

	for (i=0; i<new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		if (im->trueColor) {
			for (j=0; j<new_width; j++) {
				const gdFixed f_i = gd_itofx(i);
				const gdFixed f_j = gd_itofx(j);
				const gdFixed f_a = gd_mulfx(f_i, f_dy);
				const gdFixed f_b = gd_mulfx(f_j, f_dx);
				const long m = gd_fxtoi(f_a);
				const long n = gd_fxtoi(f_b);

				dst_img->tpixels[dst_offset_y][dst_offset_x++] = im->tpixels[m][n];
			}
		} else {
			for (j=0; j<new_width; j++) {
				const gdFixed f_i = gd_itofx(i);
				const gdFixed f_j = gd_itofx(j);
				const gdFixed f_a = gd_mulfx(f_i, f_dy);
				const gdFixed f_b = gd_mulfx(f_j, f_dx);
				const long m = gd_fxtoi(f_a);
				const long n = gd_fxtoi(f_b);

				dst_img->tpixels[dst_offset_y][dst_offset_x++] = colorIndex2RGBA(im->pixels[m][n]);
			}
		}
		dst_offset_y++;
	}
	return dst_img;
}